

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int execSql(sqlite3 *db,char **pzErrMsg,char *zSql)

{
  char *zFormat;
  char **in_RDX;
  sqlite3 *in_RSI;
  sqlite3 *in_RDI;
  sqlite3_stmt *pStmt;
  char **in_stack_ffffffffffffffd0;
  sqlite3_stmt **in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDX == (char **)0x0) {
    iVar1 = 7;
  }
  else {
    iVar1 = sqlite3_prepare(in_RDI,(char *)in_RSI,(int)((ulong)in_RDX >> 0x20),
                            in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (iVar1 == 0) {
      sqlite3_step((sqlite3_stmt *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      iVar1 = vacuumFinalize(in_RDI,(sqlite3_stmt *)in_RSI,in_RDX);
    }
    else {
      zFormat = sqlite3_errmsg(in_RSI);
      sqlite3SetString((char **)in_RSI,in_RDI,zFormat);
      iVar1 = sqlite3_errcode(in_RSI);
    }
  }
  return iVar1;
}

Assistant:

static int execSql(sqlite3 *db, char **pzErrMsg, const char *zSql){
  sqlite3_stmt *pStmt;
  VVA_ONLY( int rc; )
  if( !zSql ){
    return SQLITE_NOMEM;
  }
  if( SQLITE_OK!=sqlite3_prepare(db, zSql, -1, &pStmt, 0) ){
    sqlite3SetString(pzErrMsg, db, sqlite3_errmsg(db));
    return sqlite3_errcode(db);
  }
  VVA_ONLY( rc = ) sqlite3_step(pStmt);
  assert( rc!=SQLITE_ROW || (db->flags&SQLITE_CountRows) );
  return vacuumFinalize(db, pStmt, pzErrMsg);
}